

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lock_free_hash_table.h
# Opt level: O0

void __thiscall
neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::
LockFreeHashTable(LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>
                  *this,size_t expectedThreadCount,size_t expectedDataNum)

{
  iterator pvVar1;
  ulong uVar2;
  reference this_00;
  DataNode *node;
  ulong local_98;
  size_t j;
  uint32_t i_1;
  size_t each;
  size_t i;
  size_t total_bit;
  size_t level;
  size_t num;
  size_t m;
  atomic<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Node_*>
  *ptr;
  iterator __end0;
  iterator __begin0;
  array<std::atomic<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Node_*>,_256UL>
  *__range2;
  allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>
  local_21;
  size_t local_20;
  size_t expectedDataNum_local;
  size_t expectedThreadCount_local;
  LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL> *this_local;
  
  local_20 = expectedDataNum;
  expectedDataNum_local = expectedThreadCount;
  expectedThreadCount_local = (size_t)this;
  std::
  allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>
  ::allocator(&local_21);
  std::
  vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>
  ::vector(&this->data_pool_,expectedThreadCount + 2,&local_21);
  std::
  allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>
  ::~allocator(&local_21);
  epoch::
  MemoryEpoch<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Node,_std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>,_neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>
  ::MemoryEpoch(&this->epoch_,expectedDataNum_local);
  __end0 = std::
           array<std::atomic<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Node_*>,_256UL>
           ::begin(&this->root_);
  pvVar1 = std::
           array<std::atomic<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Node_*>,_256UL>
           ::end(&this->root_);
  for (; __end0 != pvVar1; __end0 = __end0 + 1) {
    std::
    atomic<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Node_*>
    ::store(__end0,(__pointer_type)0x0,memory_order_seq_cst);
  }
  num = 1;
  level = 0x10;
  for (each = 0; each < 0x40; each = each + 1) {
    num = num << 1;
  }
  for (; level < num; level = level * 0x11) {
  }
  this->maxLevel_ = 0x14;
  this->maxElement_ = num;
  uVar2 = local_20 / expectedDataNum_local;
  for (j._4_4_ = 0; j._4_4_ < expectedDataNum_local; j._4_4_ = j._4_4_ + 1) {
    for (local_98 = 0; local_98 < uVar2; local_98 = local_98 + 1) {
      this_00 = std::
                vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>
                ::operator[](&this->data_pool_,(ulong)j._4_4_);
      node = (DataNode *)malloc(0x38);
      NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>
      ::Push(this_00,node);
    }
  }
  return;
}

Assistant:

explicit LockFreeHashTable(size_t expectedThreadCount, size_t expectedDataNum = 1000000) :
            epoch_(expectedThreadCount),
            data_pool_(expectedThreadCount + 2) {
        for (std::atomic<Node *> &ptr : root_)
            ptr.store(nullptr);
        size_t m = 1, num = kArraySize, level = 1;
        size_t total_bit = sizeof(Key) * 8;
        if (total_bit <= 64) {
            for (size_t i = 0; i < total_bit; i++)
                m *= 2;
            for (; num < m; num += num * kArraySize)
                level++;
            level++;
        }
        maxLevel_ = 20;
        maxElement_ = m;

        size_t each = expectedDataNum / expectedThreadCount;
        for (uint32_t i = 0; i < expectedThreadCount; i++) {
            for (size_t j = 0; j < each; j++) {
                data_pool_[i].Push((DataNode *) malloc(sizeof(DataNode)));
            }
        }
    }